

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer_device.cpp
# Opt level: O1

Vec3fa embree::MatteMaterial__eval
                 (ISPCMatteMaterial *This,BRDF *brdf,Vec3fa *wo,DifferentialGeometry *dg,Vec3fa *wi)

{
  float fVar1;
  float fVar2;
  float *in_RDI;
  float fVar3;
  float fVar4;
  Vec3fa VVar5;
  
  fVar1 = (This->reflectance).field_0.m128[2];
  fVar2 = (This->reflectance).field_0.m128[3];
  VVar5.field_0._0_4_ = (This->reflectance).field_0.m128[0] * 0.31830987;
  VVar5.field_0._4_4_ = (This->reflectance).field_0.m128[1] * 0.31830987;
  fVar3 = (wi->field_0).m128[2] * (dg->Ns).field_0.m128[2] +
          (wi->field_0).m128[1] * (dg->Ns).field_0.m128[1] +
          (wi->field_0).m128[0] * (dg->Ns).field_0.m128[0];
  if (1.0 <= fVar3) {
    fVar3 = 1.0;
  }
  VVar5.field_0.m128[3] = (wi->field_0).m128[3] * (dg->Ns).field_0.m128[3];
  VVar5.field_0.m128[2] = fVar3;
  fVar4 = 0.0;
  if (0.0 <= fVar3) {
    fVar4 = fVar3;
  }
  *in_RDI = fVar4 * VVar5.field_0._0_4_;
  in_RDI[1] = fVar4 * VVar5.field_0._4_4_;
  in_RDI[2] = fVar4 * fVar1 * 0.31830987;
  in_RDI[3] = fVar4 * fVar2 * 0.31830987;
  return (Vec3fa)VVar5.field_0;
}

Assistant:

Vec3fa MatteMaterial__eval(ISPCMatteMaterial* This, const BRDF& brdf, const Vec3fa& wo, const DifferentialGeometry& dg, const Vec3fa& wi)
{
  Lambertian lambertian = make_Lambertian(Vec3fa((Vec3fa)This->reflectance));
  return Lambertian__eval(&lambertian,wo,dg,wi);
}